

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::BeginTryTableExpr(Validator *this,TryTableExpr *expr)

{
  bool bVar1;
  Result RVar2;
  Type TVar3;
  reference catch__00;
  TableCatch *catch_;
  iterator __end2;
  iterator __begin2;
  TryTableVector *__range2;
  TryTableExpr *expr_local;
  Validator *this_local;
  
  TVar3 = GetDeclarationType(this,&(expr->block).decl);
  RVar2 = SharedValidator::BeginTryTable
                    (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)62>).super_Expr.loc,
                     TVar3);
  Result::operator|=(&this->result_,RVar2);
  __end2 = std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::begin(&expr->catches);
  catch_ = (TableCatch *)
           std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::end(&expr->catches);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
                                *)&catch_);
    if (!bVar1) break;
    catch__00 = __gnu_cxx::
                __normal_iterator<wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
                ::operator*(&__end2);
    RVar2 = SharedValidator::OnTryTableCatch
                      (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)62>).super_Expr.loc
                       ,catch__00);
    Result::operator|=(&this->result_,RVar2);
    __gnu_cxx::
    __normal_iterator<wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
    ::operator++(&__end2);
  }
  TVar3 = GetDeclarationType(this,&(expr->block).decl);
  RVar2 = SharedValidator::EndTryTable
                    (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)62>).super_Expr.loc,
                     TVar3);
  Result::operator|=(&this->result_,RVar2);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::BeginTryTableExpr(TryTableExpr* expr) {
  result_ |=
      validator_.BeginTryTable(expr->loc, GetDeclarationType(expr->block.decl));
  for (const TableCatch& catch_ : expr->catches) {
    result_ |= validator_.OnTryTableCatch(expr->loc, catch_);
  }
  result_ |=
      validator_.EndTryTable(expr->loc, GetDeclarationType(expr->block.decl));
  return Result::Ok;
}